

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O0

void gb_corrupt_wave_ram(gb_sound_t *gb)

{
  int local_14;
  int i;
  gb_sound_t *gb_local;
  
  if ((gb->gbMode == '\0') && (gb->NoWaveCorrupt == '\0')) {
    if ((gb->snd_3).offset < 8) {
      gb->snd_regs[0x20] = gb->snd_regs[(int)((gb->snd_3).offset / 2 + 0x20)];
    }
    else {
      for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
        gb->snd_regs[local_14 + 0x20] =
             gb->snd_regs[(int)(((gb->snd_3).offset / 2 & 0xfffffffc) + 0x20 + local_14)];
      }
    }
  }
  return;
}

Assistant:

static void gb_corrupt_wave_ram(gb_sound_t *gb)
{
	if (gb->gbMode != GBMODE_DMG || gb->NoWaveCorrupt)
		return;

	if (gb->snd_3.offset < 8)
	{
		gb->snd_regs[AUD3W0] = gb->snd_regs[AUD3W0 + (gb->snd_3.offset/2)];
	}
	else
	{
		int i;
		for (i = 0; i < 4; i++)
		{
			gb->snd_regs[AUD3W0 + i] = gb->snd_regs[AUD3W0 + ((gb->snd_3.offset / 2) & ~0x03) + i];
		}
	}
}